

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubString.cpp
# Opt level: O0

JavascriptString * Js::SubString::New(JavascriptString *string,charcount_t start,charcount_t length)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  int iVar4;
  undefined4 *puVar5;
  JavascriptLibrary *this;
  char16 *pcVar6;
  undefined4 extraout_var;
  Recycler *alloc;
  SubString *this_00;
  TrackAllocData local_68;
  void *local_40;
  void *originalFullStringReference;
  char16 *subString;
  Recycler *recycler;
  ScriptContext *scriptContext;
  charcount_t length_local;
  charcount_t start_local;
  JavascriptString *string_local;
  
  scriptContext._0_4_ = length;
  scriptContext._4_4_ = start;
  _length_local = string;
  bVar2 = IsValidCharCount((ulong)start);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
                                ,0x19,"(IsValidCharCount(start))","start is out of range");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsValidCharCount((ulong)(charcount_t)scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
                                ,0x1a,"(IsValidCharCount(length))","length is out of range");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&_length_local->super_RecyclableObject);
  if ((charcount_t)scriptContext == 0) {
    this = ScriptContext::GetLibrary((ScriptContext *)recycler);
    string_local = JavascriptLibrary::GetEmptyString(this);
  }
  else {
    subString = (char16 *)ScriptContext::GetRecycler((ScriptContext *)recycler);
    cVar3 = JavascriptString::GetLength(_length_local);
    if (cVar3 < scriptContext._4_4_ + (charcount_t)scriptContext) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
                                  ,0x24,"(string->GetLength() >= start + length)",
                                  "string->GetLength() >= start + length");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pcVar6 = JavascriptString::GetString(_length_local);
    originalFullStringReference = pcVar6 + scriptContext._4_4_;
    iVar4 = (*(_length_local->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])();
    pcVar6 = subString;
    local_40 = (void *)CONCAT44(extraout_var,iVar4);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SubString.cpp"
               ,0x30);
    alloc = Memory::Recycler::TrackAllocInfo((Recycler *)pcVar6,&local_68);
    this_00 = (SubString *)new<Memory::Recycler>(0x30,alloc,0x43c4b0);
    SubString(this_00,local_40,(char16 *)originalFullStringReference,(charcount_t)scriptContext,
              (ScriptContext *)recycler);
    string_local = (JavascriptString *)this_00;
  }
  return string_local;
}

Assistant:

JavascriptString* SubString::New(JavascriptString* string, charcount_t start, charcount_t length)
    {
        AssertMsg( IsValidCharCount(start), "start is out of range" );
        AssertMsg( IsValidCharCount(length), "length is out of range" );

        ScriptContext *scriptContext = string->GetScriptContext();
        if (!length)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        Recycler* recycler = scriptContext->GetRecycler();

        AssertOrFailFast(string->GetLength() >= start + length);
        const char16 * subString = string->GetString() + start;
        void const * originalFullStringReference = string->GetOriginalStringReference();

#if SYSINFO_IMAGE_BASE_AVAILABLE
        AssertMsg(AutoSystemInfo::IsJscriptModulePointer((void*)originalFullStringReference)
            || recycler->IsValidObject((void*)originalFullStringReference)
            || (VirtualTableInfo<PropertyRecord>::HasVirtualTable((void*)originalFullStringReference) && ((PropertyRecord*)originalFullStringReference)->IsBound())
            || (string->GetLength() == 1 && originalFullStringReference == scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(string->GetString()[0])->UnsafeGetBuffer()),
            "Owning pointer for SubString must be static or GC pointer, property record bound by thread allocator, or character buffer in global string cache");
#endif

        return RecyclerNew(recycler, SubString, originalFullStringReference, subString, length, scriptContext);
    }